

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

void init_curses_ui(void)

{
  setlocale(6,"");
  curses_scr = (SCREEN *)newterm(0,_stdout,_stdin);
  set_term(curses_scr);
  if ((0x17 < _LINES) && (0x4f < _COLS)) {
    noecho();
    raw();
    nonl();
    meta(basewin,1);
    leaveok(basewin,1);
    orig_cursor = curs_set(1);
    keypad(basewin,1);
    define_key("\x1bOq",0x15f);
    define_key("\x1bOr",0x102);
    define_key("\x1bOs",0x160);
    define_key("\x1bOt",0x104);
    define_key("\x1bOu",0x15e);
    define_key("\x1bOv",0x105);
    define_key("\x1bOw",0x15c);
    define_key("\x1bOx",0x103);
    define_key("\x1bOy",0x15d);
    define_key("\x1bOl",0x2b);
    define_key("\x1bOn",0x2e);
    define_key("\x1bOp",0x30);
    define_key("\x1b[11~",0x109);
    define_key("\x1b[12~",0x10a);
    define_key("\x1b[13~",0x10b);
    define_key("\x1b[14~",0x10c);
    set_escdelay(0x14);
    init_nhcolors();
    ui_flags.playmode = 0;
    ui_flags.unicode = _nc_unicode_locale();
    basewin = _stdscr;
    return;
  }
  fprintf(_stderr,"Sorry, your terminal is too small for DynaMoHack. Current: (%x, %x)\n");
  endwin();
  exit(0);
}

Assistant:

void init_curses_ui(void)
{
    /* set up the default system locale by reading the environment variables */
    setlocale(LC_ALL, "");

    curses_scr = newterm(NULL, stdout, stdin);
    set_term(curses_scr);

    if (LINES < 24 || COLS < COLNO) {
	fprintf(stderr, "Sorry, your terminal is too small for DynaMoHack. Current: (%x, %x)\n", COLS, LINES);
	endwin();
	exit(0);
    }

    noecho();
    raw();
    nonl();
    meta(basewin, TRUE);
    leaveok(basewin, TRUE);
    orig_cursor = curs_set(1);
    keypad(basewin, TRUE);
    define_extra_keypad_keys();
    set_escdelay(20);

    init_nhcolors();
    ui_flags.playmode = MODE_NORMAL;
    ui_flags.unicode = _nc_unicode_locale();

    /* with PDCurses/Win32 stdscr is not NULL before newterm runs, which caused
     * crashes. So basewin is a copy of stdscr which is known to be NULL before
     * curses is inited. */
    basewin = stdscr;
}